

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O1

void __thiscall interpreter::Interpreter::Run(Interpreter *this,string *data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *script_00;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  shared_ptr<ScriptAstNode> script;
  shared_ptr<bytecode::CompiledFile> compiledFile;
  shared_ptr<runtime::VirtualMachine> runtime;
  undefined1 local_1a;
  bool local_19;
  
  parseScript((ostream *)&local_60,(string *)this->out);
  this_00 = script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  runtime.super___shared_ptr<runtime::VirtualMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_60;
  if (script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               statements).
               super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&((script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    statements).
                    super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&((script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               statements).
               super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&((script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    statements).
                    super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  script_00 = &script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  compile((shared_ptr<ScriptAstNode> *)script_00);
  if (this_00 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  local_19 = false;
  compiledFile.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<runtime::VirtualMachine,std::allocator<runtime::VirtualMachine>,bool,std::ostream&,std::istream&,std::shared_ptr<bytecode::CompiledFile>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&runtime,
             (VirtualMachine **)
             &compiledFile.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(allocator<runtime::VirtualMachine> *)&local_1a,&local_19,this->out,
             this->in,(shared_ptr<bytecode::CompiledFile> *)script_00);
  ::runtime::VirtualMachine::run
            ((VirtualMachine *)
             compiledFile.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  if (runtime.super___shared_ptr<runtime::VirtualMachine,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               runtime.super___shared_ptr<runtime::VirtualMachine,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  if (compiledFile.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               compiledFile.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  if (script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               script.super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void interpreter::Interpreter::Run(const std::string & data) {

  std::shared_ptr<ScriptAstNode> script = parseScript(this->out, data);
  auto compiledFile = compile(script);
  auto runtime = std::make_shared<runtime::VirtualMachine>(false, this->out, this->in, std::move(compiledFile));
  runtime->run();
}